

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

void pbrt::PtexTextureBase::ReportStats(void)

{
  long in_FS_OFFSET;
  Stats stats;
  undefined1 local_40 [8];
  long local_38;
  long local_20;
  long local_10;
  
  if (cache != (long *)0x0) {
    (**(code **)(*cache + 0x48))(cache,local_40);
    *(long *)(in_FS_OFFSET + -0x5c8) = *(long *)(in_FS_OFFSET + -0x5c8) + local_20;
    *(long *)(in_FS_OFFSET + -0x5c0) = *(long *)(in_FS_OFFSET + -0x5c0) + local_10;
    if (local_38 < *(long *)(in_FS_OFFSET + -0x5b8)) {
      local_38 = *(long *)(in_FS_OFFSET + -0x5b8);
    }
    *(long *)(in_FS_OFFSET + -0x5b8) = local_38;
  }
  return;
}

Assistant:

void PtexTextureBase::ReportStats() {
    if (!cache)
        return;

    Ptex::PtexCache::Stats stats;
    cache->getStats(stats);

    nFilesAccessed += stats.filesAccessed;
    nBlockReads += stats.blockReads;
    peakMemoryUsed = std::max(peakMemoryUsed, int64_t(stats.peakMemUsed));
}